

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

void __thiscall QtMWidgets::TableViewCellLayout::setGeometry(TableViewCellLayout *this,QRect *rect)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QRect *pQVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  QRect r;
  QRect local_d0;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_60;
  QArrayData *local_48;
  long local_38;
  
  QLayout::setGeometry((QRect *)this);
  auVar13 = QLayout::contentsMargins();
  local_d0.x1 = rect->x1 + auVar13._0_4_;
  local_d0.x2 = rect->x2 - auVar13._8_4_;
  local_d0.y1 = auVar13._4_4_ + rect->y1;
  local_d0.y2 = rect->y2 - auVar13._12_4_;
  lVar4 = (**(code **)(*(long *)this->accessoryWidget + 0x70))();
  QLabel::pixmap();
  cVar2 = QPixmap::isNull();
  bVar11 = true;
  if (cVar2 == '\0') {
    QLabel::text();
    bVar11 = local_38 != 0;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
  }
  QPixmap::~QPixmap((QPixmap *)&local_a8);
  iVar10 = (int)((ulong)lVar4 >> 0x20);
  iVar6 = (int)lVar4;
  if (bVar11) {
    if (((iVar10 != 0 && -1 < lVar4) && 0 < iVar6) ||
       (TextLabel::text(&local_a8,this->textLabel), local_a8.d.size != 0)) {
      bVar11 = false;
      bVar12 = false;
    }
    else {
      TextLabel::text(&local_60,this->detailedTextLabel);
      bVar12 = local_60.d.size == 0;
      bVar11 = true;
    }
    if ((bVar11) && (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
      }
    }
    if (((iVar10 == 0 || -1 >= lVar4) || 0 >= iVar6) &&
       (piVar1 = (int *)CONCAT44(local_a8.d.d._4_4_,(int)local_a8.d.d), piVar1 != (int *)0x0)) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d.d._4_4_,(int)local_a8.d.d),2,8);
      }
    }
    if (!bVar12) {
      uVar5 = (**(code **)(*(long *)this->imageLabel + 0x70))();
      local_c0.d.d._0_4_ = local_d0.x1;
      local_c0.d.d._4_4_ = local_d0.y1;
      local_c0.d.ptr._0_4_ = (int)uVar5 + -1 + local_d0.x1;
      local_c0.d.ptr._4_4_ = (int)((ulong)uVar5 >> 0x20) + local_d0.y1 + -1;
      QWidget::setGeometry((QRect *)this->imageLabel);
      iVar3 = (**(code **)(*(long *)this + 0x60))(this);
      iVar3 = iVar3 + (int)uVar5;
      goto LAB_00162c17;
    }
    QWidget::setGeometry((QRect *)this->imageLabel);
    local_c0.d.d._0_4_ = local_d0.x1;
    local_c0.d.d._4_4_ = local_d0.y1;
    local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
    local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
    QWidget::setGeometry((QRect *)this->textLabel);
    local_c0.d.d._0_4_ = local_d0.x1;
    local_c0.d.d._4_4_ = local_d0.y1;
    local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
    local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
    QWidget::setGeometry((QRect *)this->detailedTextLabel);
    pQVar9 = (QRect *)this->accessoryWidget;
    local_c0.d.d._0_4_ = local_d0.x1;
    local_c0.d.d._4_4_ = local_d0.y1;
LAB_00162f26:
    local_c0.d.ptr._4_4_ = local_c0.d.d._4_4_ + -1;
    local_c0.d.ptr._0_4_ = (int)local_c0.d.d + -1;
LAB_00162f2b:
    QWidget::setGeometry(pQVar9);
  }
  else {
    local_a8.d.d._0_4_ = local_d0.x1;
    local_a8.d.d._4_4_ = local_d0.y1;
    local_a8.d.ptr._0_4_ = local_d0.x1 + -1;
    local_a8.d.ptr._4_4_ = local_d0.y1 + -1;
    QWidget::setGeometry((QRect *)this->imageLabel);
    iVar3 = 0;
LAB_00162c17:
    if ((iVar10 == 0 || lVar4 < 0) || iVar6 < 1) {
      local_c0.d.d._0_4_ = local_d0.x1;
      local_c0.d.d._4_4_ = local_d0.y1;
      local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
      local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
      QWidget::setGeometry((QRect *)this->accessoryWidget);
      iVar6 = 0;
    }
    else {
      TextLabel::text(&local_c0,this->textLabel);
      if (local_c0.d.size == 0) {
        TextLabel::text(&local_78,this->detailedTextLabel);
        bVar11 = local_78.d.size == 0;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
          }
        }
      }
      else {
        bVar11 = false;
      }
      piVar1 = (int *)CONCAT44(local_c0.d.d._4_4_,(int)local_c0.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_c0.d.d._4_4_,(int)local_c0.d.d),2,8);
        }
      }
      if (bVar11) {
        local_c0.d.d._0_4_ = local_d0.x1;
        local_c0.d.d._4_4_ = local_d0.y1;
        local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
        local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
        QWidget::setGeometry((QRect *)this->textLabel);
        local_c0.d.d._0_4_ = local_d0.x1;
        local_c0.d.d._4_4_ = local_d0.y1;
        local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
        local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
        QWidget::setGeometry((QRect *)this->detailedTextLabel);
        iVar6 = (local_d0.y2 - local_d0.y1) + 1;
        local_c0.d.ptr._4_4_ = 0;
        iVar7 = iVar6 - iVar10;
        if (iVar7 != 0 && iVar10 <= iVar6) {
          local_c0.d.ptr._4_4_ = iVar7 / 2;
        }
        pQVar9 = (QRect *)this->accessoryWidget;
        local_c0.d.d._0_4_ = iVar3 + local_d0.x1;
        local_c0.d.d._4_4_ = local_d0.y1 + local_c0.d.ptr._4_4_;
        local_c0.d.ptr._0_4_ = local_d0.x2;
        local_c0.d.ptr._4_4_ = local_d0.y2 - local_c0.d.ptr._4_4_;
        goto LAB_00162f2b;
      }
      TextLabel::text(&local_c0,this->textLabel);
      bVar11 = local_c0.d.size == 0;
      if ((bVar11) && (TextLabel::text(&local_90,this->detailedTextLabel), local_90.d.size == 0)) {
        bVar11 = true;
        bVar12 = false;
      }
      else {
        bVar12 = true;
      }
      if ((bVar11) && (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
        }
      }
      piVar1 = (int *)CONCAT44(local_c0.d.d._4_4_,(int)local_c0.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_c0.d.d._4_4_,(int)local_c0.d.d),2,8);
        }
      }
      if (!bVar12) {
        local_c0.d.d._0_4_ = local_d0.x1;
        local_c0.d.d._4_4_ = local_d0.y1;
        local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
        local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
        QWidget::setGeometry((QRect *)this->textLabel);
        local_c0.d.d._0_4_ = local_d0.x1;
        local_c0.d.d._4_4_ = local_d0.y1;
        local_c0.d.ptr._0_4_ = local_d0.x1 + -1;
        local_c0.d.ptr._4_4_ = local_d0.y1 + -1;
        QWidget::setGeometry((QRect *)this->detailedTextLabel);
        pQVar9 = (QRect *)this->accessoryWidget;
        local_c0.d.d._0_4_ = local_d0.x1;
        local_c0.d.d._4_4_ = local_d0.y1;
        goto LAB_00162f26;
      }
      iVar7 = (local_d0.y2 - local_d0.y1) + 1;
      local_c0.d.ptr._4_4_ = 0;
      iVar8 = iVar7 - iVar10;
      if (iVar8 != 0 && iVar10 <= iVar7) {
        local_c0.d.ptr._4_4_ = iVar8 / 2;
      }
      local_c0.d.d._0_4_ = (local_d0.x2 - iVar6) + 1;
      local_c0.d.d._4_4_ = local_d0.y1 + local_c0.d.ptr._4_4_;
      local_c0.d.ptr._0_4_ = local_d0.x2;
      local_c0.d.ptr._4_4_ = local_d0.y2 - local_c0.d.ptr._4_4_;
      QWidget::setGeometry((QRect *)this->accessoryWidget);
    }
    setTextGeometry(this,&local_d0,iVar3,iVar6);
  }
  return;
}

Assistant:

void
TableViewCellLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int imageOffset = 0;

	const QSize accessorySizeHint = accessoryWidget->sizeHint();

	if( imageLabel->pixmap( Qt::ReturnByValue ).isNull() || !imageLabel->text().isEmpty() )
	{
		if( accessorySizeHint.isEmpty() && textLabel->text().isEmpty() &&
			detailedTextLabel->text().isEmpty() )
		{
			imageLabel->setGeometry( r );
			textLabel->setGeometry( r.x(), r.y(), 0, 0 );
			detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
			accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

			return;
		}

		const QSize imageSize = imageLabel->sizeHint();

		imageLabel->setGeometry( r.x(), r.y(),
			imageSize.width(), imageSize.height() );

		imageOffset += imageSize.width() + spacing();
	}
	else
		imageLabel->setGeometry( r.x(), r.y(), 0, 0 );

	if( accessorySizeHint.isEmpty() )
	{
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

		setTextGeometry( r, imageOffset, 0 );
	}
	else if( textLabel->text().isEmpty() && detailedTextLabel->text().isEmpty() &&
		!accessorySizeHint.isEmpty() )
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );

		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + imageOffset, r.y() + offset,
			r.width() - imageOffset, r.height() - offset * 2 );
	}
	else if( ( !textLabel->text().isEmpty() || !detailedTextLabel->text().isEmpty() ) &&
		!accessorySizeHint.isEmpty() )
	{
		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + r.width() -
			accessorySizeHint.width(), r.y() + offset,
			accessorySizeHint.width(), r.height() - offset * 2 );

		setTextGeometry( r, imageOffset, accessorySizeHint.width() );
	}
	else
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );
	}
}